

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_header_table.cpp
# Opt level: O2

void one_work(string *tmp,
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BmsHeader,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BmsHeader>_>_>
             *table_clone,char *key)

{
  iterator it;
  allocator local_39;
  key_type local_38;
  
  std::__cxx11::string::string((string *)&local_38,key,&local_39);
  it = std::
       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BmsHeader>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BmsHeader>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BmsHeader>_>_>
       ::find(&table_clone->_M_t,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if ((_Rb_tree_header *)it._M_node != &(table_clone->_M_t)._M_impl.super__Rb_tree_header) {
    introduceHeaderIter(tmp,(iterator)it._M_node);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,BmsHeader>,std::_Select1st<std::pair<std::__cxx11::string_const,BmsHeader>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,BmsHeader>>>
    ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,BmsHeader>,std::_Select1st<std::pair<std::__cxx11::string_const,BmsHeader>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,BmsHeader>>>
                        *)table_clone,it);
  }
  return;
}

Assistant:

static void
one_work(std::string& tmp, std::map<std::string, BmsHeader>& table_clone, const char* key)
{
	std::map<std::string, BmsHeader>::iterator it = table_clone.find(key);
	if (it != table_clone.end()) {
		introduceHeaderIter(tmp, it);
		table_clone.erase(it);
	}
}